

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O2

void __thiscall CItems::RenderLaser(CItems *this,CNetObj_Laser *pCurrent)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CGameClient *pCVar5;
  CNetObj_GameData *pCVar6;
  IGraphics *pIVar7;
  int iVar8;
  IClient *pIVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = pCurrent->m_X;
  uVar3 = pCurrent->m_Y;
  uVar2 = pCurrent->m_FromX;
  uVar4 = pCurrent->m_FromY;
  if (RenderLaser(CNetObj_Laser_const*)::s_LastGameTick == '\0') {
    iVar8 = __cxa_guard_acquire(&RenderLaser(CNetObj_Laser_const*)::s_LastGameTick);
    if (iVar8 != 0) {
      RenderLaser::s_LastGameTick = ((this->super_CComponent).m_pClient)->m_pClient->m_CurGameTick;
      __cxa_guard_release(&RenderLaser(CNetObj_Laser_const*)::s_LastGameTick);
    }
  }
  if (RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick == '\0') {
    iVar8 = __cxa_guard_acquire(&RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick);
    if (iVar8 != 0) {
      RenderLaser::s_LastIntraTick =
           ((this->super_CComponent).m_pClient)->m_pClient->m_GameIntraTick;
      __cxa_guard_release(&RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick);
    }
  }
  pCVar5 = (this->super_CComponent).m_pClient;
  pCVar6 = (pCVar5->m_Snap).m_pGameData;
  if ((pCVar6 == (CNetObj_GameData *)0x0) || ((pCVar6->m_GameStateFlags & 0x1c) == 0)) {
    pIVar9 = pCVar5->m_pClient;
    iVar8 = pIVar9->m_CurGameTick;
    RenderLaser::s_LastIntraTick = pIVar9->m_GameIntraTick;
    RenderLaser::s_LastGameTick = iVar8;
  }
  else {
    pIVar9 = pCVar5->m_pClient;
    iVar8 = pIVar9->m_CurGameTick;
  }
  fVar12 = (float)(int)uVar1;
  fVar15 = (float)(int)uVar3;
  fVar16 = (float)(int)uVar2;
  fVar17 = (float)(int)uVar4;
  fVar18 = fVar12 - fVar16;
  fVar20 = fVar15 - fVar17;
  fVar10 = SQRT(fVar18 * fVar18 + fVar20 * fVar20);
  fVar19 = ((((float)(iVar8 - pCurrent->m_StartTick) + RenderLaser::s_LastIntraTick) * 1000.0) /
           (float)pIVar9->m_GameTickSpeed) /
           ((float)(pCVar5->m_Tuning).m_LaserBounceDelay.m_Value / 100.0);
  fVar11 = 1.0;
  if (fVar19 <= 1.0) {
    fVar11 = fVar19;
  }
  fVar11 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                  ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar11));
  (*(pCVar5->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x13])(pIVar7,0xffffffffffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar19 = fVar11 * 7.0;
  auVar13._0_8_ = CONCAT44(fVar18,fVar20) ^ 0x8000000000000000;
  auVar13._8_4_ = fVar20;
  auVar13._12_4_ = fVar20;
  auVar14._4_4_ = fVar10;
  auVar14._0_4_ = fVar10;
  auVar14._8_4_ = fVar10;
  auVar14._12_4_ = fVar10;
  auVar14 = divps(auVar13,auVar14);
  fVar10 = fVar19 * auVar14._0_4_;
  fVar19 = fVar19 * auVar14._4_4_;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_48 = CONCAT44(fVar17 - fVar19,fVar16 - fVar10);
  uStack_40 = CONCAT44(fVar19 + fVar17,fVar10 + fVar16);
  local_38 = fVar12 - fVar10;
  fStack_34 = fVar15 - fVar19;
  fStack_30 = fVar10 + fVar12;
  fStack_2c = fVar19 + fVar15;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1e])(pIVar7,&local_48,1);
  fVar11 = fVar11 * 5.0;
  fVar10 = fVar11 * auVar14._0_4_;
  fVar11 = fVar11 * auVar14._4_4_;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_48 = CONCAT44(fVar17 - fVar11,fVar16 - fVar10);
  uStack_40 = CONCAT44(fVar11 + fVar17,fVar10 + fVar16);
  local_38 = fVar12 - fVar10;
  fStack_34 = fVar15 - fVar11;
  fStack_30 = fVar10 + fVar12;
  fStack_2c = fVar11 + fVar15;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1e])(pIVar7,&local_48,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x13])
            (pIVar7,(ulong)(uint)g_pData->m_aImages[3].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  CRenderTools::SelectSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,
             *(int *)(&DAT_001c9ea0 + (long)(RenderLaser::s_LastGameTick % 3) * 4),0,0,0);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
            ((float)RenderLaser::s_LastGameTick);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  uStack_50 = 0x41c00000;
  uStack_4c = 0x41c00000;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_58 = fVar12;
  fStack_54 = fVar15;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,&local_58,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  uStack_50 = 0x41a00000;
  uStack_4c = 0x41a00000;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_58 = fVar12;
  fStack_54 = fVar15;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,&local_58,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CItems::RenderLaser(const struct CNetObj_Laser *pCurrent)
{
	const vec2 Pos = vec2(pCurrent->m_X, pCurrent->m_Y);
	const vec2 From = vec2(pCurrent->m_FromX, pCurrent->m_FromY);
	const vec2 Dir = normalize(Pos-From);

	static int s_LastGameTick = Client()->GameTick();
	static float s_LastIntraTick = Client()->IntraGameTick();
	if(!m_pClient->IsWorldPaused())
	{
		s_LastGameTick = Client()->GameTick();
		s_LastIntraTick = Client()->IntraGameTick();
	}

	// This is not using s_LastGameTick because m_StartTick is synchronized by the server
	const float LifetimeMillis = 1000.0f * (Client()->GameTick() - pCurrent->m_StartTick + s_LastIntraTick) / Client()->GameTickSpeed();
	const float RemainingRelativeLifetime = 1.0f - clamp(LifetimeMillis / m_pClient->m_Tuning.m_LaserBounceDelay, 0.0f, 1.0f);

	Graphics()->BlendNormal();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// do outline
	const vec4 OuterColor(0.075f, 0.075f, 0.25f, 1.0f);
	const vec2 Outer = vec2(Dir.y, -Dir.x) * (7.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(OuterColor);
	IGraphics::CFreeformItem Freeform(
			From.x-Outer.x, From.y-Outer.y,
			From.x+Outer.x, From.y+Outer.y,
			Pos.x-Outer.x, Pos.y-Outer.y,
			Pos.x+Outer.x, Pos.y+Outer.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	// do inner
	const vec4 InnerColor(0.5f, 0.5f, 1.0f, 1.0f);
	const vec2 Inner = vec2(Dir.y, -Dir.x) * (5.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(InnerColor);
	Freeform = IGraphics::CFreeformItem(
			From.x-Inner.x, From.y-Inner.y,
			From.x+Inner.x, From.y+Inner.y,
			Pos.x-Inner.x, Pos.y-Inner.y,
			Pos.x+Inner.x, Pos.y+Inner.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	Graphics()->QuadsEnd();

	// render head
	Graphics()->BlendNormal();
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_PARTICLES].m_Id);
	Graphics()->QuadsBegin();

	const int aSprites[] = { SPRITE_PART_SPLAT01, SPRITE_PART_SPLAT02, SPRITE_PART_SPLAT03 };
	RenderTools()->SelectSprite(aSprites[s_LastGameTick%3]);
	Graphics()->QuadsSetRotation(s_LastGameTick);
	Graphics()->SetColor(OuterColor);
	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 24, 24);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->SetColor(InnerColor);
	QuadItem = IGraphics::CQuadItem(Pos.x, Pos.y, 20, 20);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsEnd();

	Graphics()->BlendNormal();
}